

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O1

size_t __thiscall
axl::enc::CharCodec::decode_utf8
          (CharCodec *this,String_utf8 *string,void *p0,size_t size,utf32_t replacement)

{
  BufHdr *pBVar1;
  size_t sVar2;
  long lVar3;
  void *pvVar4;
  char cVar5;
  undefined1 auVar6 [16];
  DecoderState state;
  utf8_t tmpBuffer [256];
  undefined4 local_13c;
  C local_138 [264];
  
  pBVar1 = (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)(pBVar1 + 1)
      ;
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
    }
  }
  local_13c = 0;
  pvVar4 = (void *)(size + (long)p0);
  do {
    if (pvVar4 <= p0) goto LAB_001439d4;
    auVar6 = (**(code **)(*(long *)this + 0x88))
                       (this,&local_13c,local_138,0x100,p0,(long)pvVar4 - (long)p0,replacement);
    lVar3 = auVar6._8_8_;
    if (lVar3 == 0) {
      cVar5 = '\x03';
    }
    else {
      sVar2 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
                        (string,0xffffffffffffffff,local_138,auVar6._0_8_);
      cVar5 = sVar2 == 0xffffffffffffffff;
      if ((bool)cVar5) {
        lVar3 = 0;
      }
      p0 = (void *)((long)p0 + lVar3);
    }
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
LAB_001439d4:
    sVar2 = (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

size_t
CharCodec::decode_utf8(
	sl::String_utf8* string,
	const void* p0,
	size_t size,
	utf32_t replacement
) {
	string->clear();

	DecoderState state = 0;
	const char* p = (const char*)p0;
	const char* end = p + size;
	while (p < end) {
		utf8_t tmpBuffer[256];
		ConvertLengthResult result = decode_utf8(
			&state,
			tmpBuffer,
			countof(tmpBuffer),
			p,
			end - p,
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t length = string->append(tmpBuffer, result.m_dstLength);
		if (length == -1)
			return -1;

		p += result.m_srcLength;
	}

	return string->getLength();
}